

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int isDistinctRedundant(Parse *pParse,SrcList *pTabList,WhereClause *pWC,ExprList *pDistinct)

{
  byte bVar1;
  short sVar2;
  int iCur;
  Index *pIdx;
  char *pcVar3;
  Expr *pEVar4;
  bool bVar5;
  int iVar6;
  WhereTerm *pWVar7;
  CollSeq *pCVar8;
  ExprList_item *pEVar9;
  long lVar10;
  long lVar11;
  Expr *pEVar12;
  ulong uVar13;
  byte bVar14;
  int local_4c;
  
  if (pTabList->nSrc == 1) {
    iCur = pTabList->a[0].iCursor;
    if (0 < (long)pDistinct->nExpr) {
      lVar11 = 0;
      do {
        pEVar12 = pDistinct->a[lVar11].pExpr;
        while ((pEVar12 != (Expr *)0x0 && ((pEVar12->flags & 0x82000) != 0))) {
          if ((pEVar12->flags >> 0x13 & 1) == 0) {
            pEVar9 = (ExprList_item *)&pEVar12->pLeft;
          }
          else {
            pEVar9 = ((pEVar12->x).pList)->a;
          }
          pEVar12 = pEVar9->pExpr;
        }
        bVar5 = false;
        if ((pEVar12 != (Expr *)0x0) && ((pEVar12->op == 0xa9 || (pEVar12->op == 0xa7)))) {
          if ((pEVar12->iTable == iCur) && (pEVar12->iColumn < 0)) {
            bVar5 = true;
          }
          else {
            bVar5 = false;
          }
        }
        if (bVar5) {
          return 1;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != pDistinct->nExpr);
    }
    for (pIdx = (pTabList->a[0].pTab)->pIndex; pIdx != (Index *)0x0; pIdx = pIdx->pNext) {
      if ((pIdx->onError != '\0') && (pIdx->pPartIdxWhere == (Expr *)0x0)) {
        if (pIdx->nKeyCol == 0) {
          uVar13 = 0;
        }
        else {
          uVar13 = 0;
          do {
            pWVar7 = sqlite3WhereFindTerm(pWC,iCur,(int)uVar13,0xffffffffffffffff,2,pIdx);
            if (pWVar7 == (WhereTerm *)0x0) {
              if (pDistinct->nExpr < 1) break;
              pcVar3 = pIdx->azColl[uVar13];
              lVar11 = 0;
              do {
                pEVar12 = pDistinct->a[lVar11].pExpr;
                pEVar4 = pEVar12;
                while ((pEVar4 != (Expr *)0x0 && ((pEVar4->flags & 0x82000) != 0))) {
                  if ((pEVar4->flags >> 0x13 & 1) == 0) {
                    pEVar9 = (ExprList_item *)&pEVar4->pLeft;
                  }
                  else {
                    pEVar9 = ((pEVar4->x).pList)->a;
                  }
                  pEVar4 = pEVar9->pExpr;
                }
                bVar5 = true;
                if (((pEVar4 != (Expr *)0x0) &&
                    (((pEVar4->op == 0xa9 || (pEVar4->op == 0xa7)) &&
                     (pEVar4->iColumn == pIdx->aiColumn[uVar13])))) && (pEVar4->iTable == iCur)) {
                  pCVar8 = sqlite3ExprCollSeq(pParse,pEVar12);
                  if (pCVar8 == (CollSeq *)0x0) {
                    pCVar8 = pParse->db->pDfltColl;
                  }
                  lVar10 = 0;
                  do {
                    bVar14 = pCVar8->zName[lVar10];
                    bVar1 = pcVar3[lVar10];
                    bVar5 = bVar14 != bVar1;
                    if (bVar14 == bVar1) {
                      if ((ulong)bVar14 == 0) {
                        local_4c = (int)lVar11;
                        break;
                      }
                    }
                    else if (""[bVar14] != ""[bVar1]) break;
                    lVar10 = lVar10 + 1;
                  } while( true );
                }
                iVar6 = local_4c;
                if (!bVar5) goto LAB_0019cf1a;
                lVar11 = lVar11 + 1;
              } while (lVar11 < pDistinct->nExpr);
              iVar6 = -1;
LAB_0019cf1a:
              if (iVar6 < 0) break;
              sVar2 = pIdx->aiColumn[uVar13];
              if ((long)sVar2 < 0) {
                bVar14 = sVar2 == -1;
              }
              else {
                bVar14 = pIdx->pTable->aCol[sVar2].field_0x8 & 0xf;
              }
              if (bVar14 == 0) break;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < pIdx->nKeyCol);
        }
        if ((uint)uVar13 == (uint)pIdx->nKeyCol) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int isDistinctRedundant(
  Parse *pParse,            /* Parsing context */
  SrcList *pTabList,        /* The FROM clause */
  WhereClause *pWC,         /* The WHERE clause */
  ExprList *pDistinct       /* The result set that needs to be DISTINCT */
){
  Table *pTab;
  Index *pIdx;
  int i;
  int iBase;

  /* If there is more than one table or sub-select in the FROM clause of
  ** this query, then it will not be possible to show that the DISTINCT
  ** clause is redundant. */
  if( pTabList->nSrc!=1 ) return 0;
  iBase = pTabList->a[0].iCursor;
  pTab = pTabList->a[0].pTab;

  /* If any of the expressions is an IPK column on table iBase, then return
  ** true. Note: The (p->iTable==iBase) part of this test may be false if the
  ** current SELECT is a correlated sub-query.
  */
  for(i=0; i<pDistinct->nExpr; i++){
    Expr *p = sqlite3ExprSkipCollateAndLikely(pDistinct->a[i].pExpr);
    if( NEVER(p==0) ) continue;
    if( p->op!=TK_COLUMN && p->op!=TK_AGG_COLUMN ) continue;
    if( p->iTable==iBase && p->iColumn<0 ) return 1;
  }

  /* Loop through all indices on the table, checking each to see if it makes
  ** the DISTINCT qualifier redundant. It does so if:
  **
  **   1. The index is itself UNIQUE, and
  **
  **   2. All of the columns in the index are either part of the pDistinct
  **      list, or else the WHERE clause contains a term of the form "col=X",
  **      where X is a constant value. The collation sequences of the
  **      comparison and select-list expressions must match those of the index.
  **
  **   3. All of those index columns for which the WHERE clause does not
  **      contain a "col=X" term are subject to a NOT NULL constraint.
  */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    if( !IsUniqueIndex(pIdx) ) continue;
    if( pIdx->pPartIdxWhere ) continue;
    for(i=0; i<pIdx->nKeyCol; i++){
      if( 0==sqlite3WhereFindTerm(pWC, iBase, i, ~(Bitmask)0, WO_EQ, pIdx) ){
        if( findIndexCol(pParse, pDistinct, iBase, pIdx, i)<0 ) break;
        if( indexColumnNotNull(pIdx, i)==0 ) break;
      }
    }
    if( i==pIdx->nKeyCol ){
      /* This index implies that the DISTINCT qualifier is redundant. */
      return 1;
    }
  }

  return 0;
}